

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionDeclarationNode *node)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  string *psVar4;
  element_type *peVar5;
  FunctionDeclarationNode *in_RSI;
  long in_RDI;
  PrintVisitor visitor;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
  *arg;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *__range1;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *in_stack_fffffffffffffe28;
  unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe30;
  ostream *in_stack_fffffffffffffe38;
  PrintVisitor *in_stack_fffffffffffffe40;
  PrintVisitor *in_stack_fffffffffffffe58;
  string local_f8 [32];
  undefined1 local_d8 [24];
  string local_c0 [32];
  reference local_a0;
  _Self local_98;
  _Self local_90;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *local_88;
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  FunctionDeclarationNode *local_10;
  
  poVar2 = *(ostream **)(in_RDI + 8);
  local_10 = in_RSI;
  indent_abi_cxx11_(in_stack_fffffffffffffe58);
  poVar2 = std::operator<<(poVar2,local_30);
  poVar2 = std::operator<<(poVar2,"FunctionDeclarationNode (");
  FunctionDeclarationNode::getReturnType(local_10);
  pmVar3 = std::
           unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_fffffffffffffe30,(key_type *)in_stack_fffffffffffffe28);
  poVar2 = std::operator<<(poVar2,(string *)pmVar3);
  std::operator<<(poVar2,"):\n");
  std::__cxx11::string::~string(local_30);
  poVar2 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(in_stack_fffffffffffffe58);
  poVar2 = std::operator<<(poVar2,local_60);
  poVar2 = std::operator<<(poVar2,"Name: ");
  psVar4 = FunctionDeclarationNode::getName_abi_cxx11_(local_10);
  poVar2 = std::operator<<(poVar2,(string *)psVar4);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(local_60);
  poVar2 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(in_stack_fffffffffffffe58);
  poVar2 = std::operator<<(poVar2,local_80);
  std::operator<<(poVar2,"Arguments:\n");
  std::__cxx11::string::~string(local_80);
  local_88 = FunctionDeclarationNode::getArguments_abi_cxx11_(local_10);
  local_90._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
       ::begin(in_stack_fffffffffffffe28);
  local_98._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
       ::end(in_stack_fffffffffffffe28);
  while( true ) {
    bVar1 = std::operator!=(&local_90,&local_98);
    if (!bVar1) break;
    local_a0 = std::
               _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
               ::operator*((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
                            *)in_stack_fffffffffffffe30);
    poVar2 = *(ostream **)(in_RDI + 8);
    indent_abi_cxx11_(in_stack_fffffffffffffe58);
    poVar2 = std::operator<<(poVar2,local_c0);
    poVar2 = std::operator<<(poVar2," ");
    in_stack_fffffffffffffe58 = (PrintVisitor *)std::operator<<(poVar2,(string *)local_a0);
    poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffe58," (");
    pmVar3 = std::
             unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(in_stack_fffffffffffffe30,(key_type *)in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe40 = (PrintVisitor *)std::operator<<(poVar2,(string *)pmVar3);
    std::operator<<((ostream *)in_stack_fffffffffffffe40,")\n");
    std::__cxx11::string::~string(local_c0);
    std::
    _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
    ::operator++(&local_90);
  }
  PrintVisitor(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               (uint)((ulong)in_stack_fffffffffffffe30 >> 0x20));
  poVar2 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(in_stack_fffffffffffffe58);
  poVar2 = std::operator<<(poVar2,local_f8);
  std::operator<<(poVar2,"Body:\n");
  std::__cxx11::string::~string(local_f8);
  FunctionDeclarationNode::getBody(local_10);
  peVar5 = std::__shared_ptr_access<BlockNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<BlockNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1387ce);
  (*(peVar5->super_StatementNode).super_Node._vptr_Node[2])(peVar5,local_d8);
  ~PrintVisitor((PrintVisitor *)0x1387f1);
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionDeclarationNode& node)
{
  stream_ << indent() << "FunctionDeclarationNode (" 
    << TypeNameStrings.at(node.getReturnType()) << "):\n";
  stream_ << indent() << "Name: " << node.getName() << "\n";
  stream_ << indent() << "Arguments:\n";
  for(const auto& arg : node.getArguments())
  {
    stream_ << indent() << " " << arg.first 
      << " (" << TypeNameStrings.at(arg.second) << ")\n";
  }
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Body:\n";
  node.getBody()->accept(visitor);
}